

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifold_test.cpp
# Opt level: O0

void __thiscall Manifold_MultiCompose_Test::TestBody(Manifold_MultiCompose_Test *this)

{
  allocator<manifold::Manifold> *this_00;
  double dVar1;
  initializer_list<manifold::Manifold> __l;
  initializer_list<manifold::Manifold> __l_00;
  bool bVar2;
  char *message;
  Manifold *local_2a0;
  Manifold *local_268;
  AssertHelper local_258;
  Message local_250;
  undefined1 local_248 [8];
  AssertionResult gtest_ar;
  double local_230;
  double local_228;
  double local_220;
  vec<double,_3> local_218;
  double local_200;
  double local_1f8;
  double local_1f0;
  vec<double,_3> local_1e8;
  Manifold local_1d0 [16];
  double local_1c0;
  double local_1b8;
  double local_1b0;
  vec<double,_3> local_1a8;
  double local_190;
  double local_188;
  double local_180;
  vec<double,_3> local_178;
  Manifold local_160 [16];
  double local_150;
  double local_148;
  double local_140;
  vec<double,_3> local_138;
  Manifold *local_120;
  Manifold local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  iterator local_d8;
  size_type local_d0;
  vector<manifold::Manifold,_std::allocator<manifold::Manifold>_> local_c8;
  vector local_b0 [8];
  Manifold finalAssembly;
  allocator<manifold::Manifold> local_9d [13];
  double local_90;
  double local_88;
  double local_80;
  vec<double,_3> local_78;
  Manifold *local_60;
  Manifold local_58 [16];
  iterator local_48;
  size_type local_40;
  vector<manifold::Manifold,_std::allocator<manifold::Manifold>_> local_38;
  vector local_20 [8];
  Manifold part;
  Manifold_MultiCompose_Test *this_local;
  
  local_60 = local_58;
  local_80 = 10.0;
  local_88 = 10.0;
  local_90 = 10.0;
  linalg::vec<double,_3>::vec(&local_78,&local_80,&local_88,&local_90);
  manifold::Manifold::Cube(local_58,0);
  local_48 = local_58;
  local_40 = 1;
  std::allocator<manifold::Manifold>::allocator(local_9d);
  __l_00._M_len = local_40;
  __l_00._M_array = local_48;
  std::vector<manifold::Manifold,_std::allocator<manifold::Manifold>_>::vector
            (&local_38,__l_00,local_9d);
  manifold::Manifold::Compose(local_20);
  std::vector<manifold::Manifold,_std::allocator<manifold::Manifold>_>::~vector(&local_38);
  std::allocator<manifold::Manifold>::~allocator(local_9d);
  local_268 = (Manifold *)&local_48;
  do {
    local_268 = local_268 + -0x10;
    manifold::Manifold::~Manifold(local_268);
  } while (local_268 != local_58);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._7_1_ = 1;
  local_120 = local_118;
  manifold::Manifold::Manifold(local_120,(Manifold *)local_20);
  local_140 = 0.0;
  local_148 = 10.0;
  local_150 = 0.0;
  local_120 = (Manifold *)local_108;
  linalg::vec<double,_3>::vec(&local_138,&local_140,&local_148,&local_150);
  manifold::Manifold::Translate(local_108,local_20);
  local_180 = 1.0;
  local_188 = 0.0;
  local_190 = 0.0;
  local_120 = (Manifold *)local_f8;
  linalg::vec<double,_3>::vec(&local_178,&local_180,&local_188,&local_190);
  manifold::Manifold::Mirror(local_160,local_20);
  local_1b0 = 10.0;
  local_1b8 = 0.0;
  local_1c0 = 0.0;
  linalg::vec<double,_3>::vec(&local_1a8,&local_1b0,&local_1b8,&local_1c0);
  manifold::Manifold::Translate(local_f8,local_160);
  local_1f0 = 1.0;
  local_1f8 = 0.0;
  local_200 = 0.0;
  local_120 = (Manifold *)local_e8;
  linalg::vec<double,_3>::vec(&local_1e8,&local_1f0,&local_1f8,&local_200);
  manifold::Manifold::Mirror(local_1d0,local_20);
  local_220 = 10.0;
  local_228 = 10.0;
  local_230 = 0.0;
  linalg::vec<double,_3>::vec(&local_218,&local_220,&local_228,&local_230);
  manifold::Manifold::Translate(local_e8,local_1d0);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._7_1_ = 0;
  local_d8 = local_118;
  local_d0 = 4;
  this_00 = (allocator<manifold::Manifold> *)
            ((long)&gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            + 6);
  std::allocator<manifold::Manifold>::allocator(this_00);
  __l._M_len = local_d0;
  __l._M_array = local_d8;
  std::vector<manifold::Manifold,_std::allocator<manifold::Manifold>_>::vector
            (&local_c8,__l,this_00);
  manifold::Manifold::Compose(local_b0);
  std::vector<manifold::Manifold,_std::allocator<manifold::Manifold>_>::~vector(&local_c8);
  std::allocator<manifold::Manifold>::~allocator
            ((allocator<manifold::Manifold> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 6));
  local_2a0 = (Manifold *)&local_d8;
  do {
    local_2a0 = local_2a0 + -0x10;
    manifold::Manifold::~Manifold(local_2a0);
  } while (local_2a0 != local_118);
  manifold::Manifold::~Manifold(local_1d0);
  manifold::Manifold::~Manifold(local_160);
  dVar1 = (double)manifold::Manifold::Volume();
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_248,"finalAssembly.Volume()","4000",(float)dVar1,4000.0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar2) {
    testing::Message::Message(&local_250);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_248);
    testing::internal::AssertHelper::AssertHelper
              (&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
               ,0x31e,message);
    testing::internal::AssertHelper::operator=(&local_258,&local_250);
    testing::internal::AssertHelper::~AssertHelper(&local_258);
    testing::Message::~Message(&local_250);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  manifold::Manifold::~Manifold((Manifold *)local_b0);
  manifold::Manifold::~Manifold((Manifold *)local_20);
  return;
}

Assistant:

TEST(Manifold, MultiCompose) {
  auto part = Manifold::Compose({Manifold::Cube({10, 10, 10})});
  auto finalAssembly =
      Manifold::Compose({part, part.Translate({0, 10, 0}),
                         part.Mirror({1, 0, 0}).Translate({10, 0, 0}),
                         part.Mirror({1, 0, 0}).Translate({10, 10, 0})});
  EXPECT_FLOAT_EQ(finalAssembly.Volume(), 4000);
}